

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O1

btree_result btree_find(btree *btree,void *key,void *value_buf)

{
  ushort uVar1;
  _func_voidref_void_ptr_bid_t *p_Var2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  void *pvVar4;
  code *pcVar5;
  _func_bid_t_void_ptr *p_Var6;
  _func_void_void_ptr *p_Var7;
  void *pvVar8;
  idx_t iVar9;
  uint uVar10;
  int iVar11;
  bnode *node_00;
  bnode *pbVar12;
  bid_t bVar13;
  btree_print_func *pbVar14;
  btree_result bVar15;
  bnode *node;
  void *pvVar16;
  long lVar17;
  void *pvVar18;
  ulong uStack_60;
  bid_t abStack_58 [2];
  void *local_48;
  void *local_40;
  void *local_38;
  
  local_48 = value_buf;
  local_40 = key;
  pvVar16 = (void *)((long)&local_48 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  pvVar18 = (void *)((long)pvVar16 - (ulong)(btree->vsize + 0xf & 0xfffffff0));
  uVar10 = (uint)btree->height * 8 + 0xf & 0xfffffff0;
  pbVar14 = btree->kv_ops->init_kv_var;
  if (pbVar14 != (btree_print_func *)0x0) {
    *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109ab2;
    (*pbVar14)(btree,pvVar16,pvVar18);
  }
  uVar1 = btree->height;
  *(bid_t *)((long)pvVar18 + (ulong)uVar1 * 8 + (-8 - (ulong)uVar10)) = btree->root_bid;
  local_38 = pvVar16;
  if (uVar1 != 0) {
    lVar17 = (ulong)uVar1 + 1;
    do {
      pvVar16 = btree->blk_handle;
      bVar13 = *(bid_t *)((long)pvVar18 + lVar17 * 8 + (-0x10 - (ulong)uVar10));
      p_Var2 = btree->blk_ops->blk_read;
      *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109ae0;
      node_00 = (bnode *)(*p_Var2)(pvVar16,bVar13);
      pvVar16 = local_40;
      pbVar12 = node_00 + 1;
      if ((node_00->flag & 2) != 0) {
        pbVar12 = (bnode *)((long)&pbVar12->kvsize +
                           (ulong)((ushort)(pbVar12->kvsize << 8 | pbVar12->kvsize >> 8) + 0x11 &
                                  0xfffffff0));
      }
      (node_00->field_4).data = pbVar12;
      *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109b16;
      iVar9 = _btree_find_entry(btree,node_00,pvVar16);
      pvVar16 = local_38;
      if (iVar9 == 0xffff) {
LAB_00109ba1:
        p_Var7 = btree->blk_ops->blk_operation_end;
        if (p_Var7 != (_func_void_void_ptr *)0x0) {
          pvVar16 = btree->blk_handle;
          *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109bb4;
          (*p_Var7)(pvVar16);
        }
        pbVar14 = btree->kv_ops->free_kv_var;
        bVar15 = BTREE_RESULT_FAIL;
        goto LAB_00109bc2;
      }
      p_Var3 = btree->kv_ops->get_kv;
      *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109b37;
      (*p_Var3)(node_00,iVar9,pvVar16,pvVar18);
      pvVar8 = local_40;
      if (lVar17 == 2) {
        pvVar4 = btree->aux;
        pcVar5 = (code *)btree->kv_ops->cmp;
        *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109b4f;
        iVar11 = (*pcVar5)(pvVar8,pvVar16,pvVar4);
        pvVar16 = local_48;
        if (iVar11 != 0) goto LAB_00109ba1;
        pbVar14 = btree->kv_ops->set_value;
        *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109b64;
        (*pbVar14)(btree,pvVar16,pvVar18);
      }
      else {
        p_Var6 = btree->kv_ops->value2bid;
        *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109b6c;
        bVar13 = (*p_Var6)(pvVar18);
        *(bid_t *)((long)pvVar18 + lVar17 * 8 + (-0x18 - (ulong)uVar10)) =
             bVar13 >> 0x38 | (bVar13 & 0xff000000000000) >> 0x28 |
             (bVar13 & 0xff0000000000) >> 0x18 | (bVar13 & 0xff00000000) >> 8 |
             (bVar13 & 0xff000000) << 8 | (bVar13 & 0xff0000) << 0x18 | (bVar13 & 0xff00) << 0x28 |
             bVar13 << 0x38;
      }
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
  }
  p_Var7 = btree->blk_ops->blk_operation_end;
  if (p_Var7 != (_func_void_void_ptr *)0x0) {
    pvVar16 = btree->blk_handle;
    *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109b94;
    (*p_Var7)(pvVar16);
  }
  pbVar14 = btree->kv_ops->free_kv_var;
  bVar15 = BTREE_RESULT_SUCCESS;
LAB_00109bc2:
  pvVar16 = local_38;
  if (pbVar14 != (btree_print_func *)0x0) {
    *(undefined8 *)((long)pvVar18 + (-8 - (ulong)uVar10)) = 0x109bd3;
    (*pbVar14)(btree,pvVar16,pvVar18);
  }
  return bVar15;
}

Assistant:

btree_result btree_find(struct btree *btree, void *key, void *value_buf)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    if (btree->kv_ops->init_kv_var) btree->kv_ops->init_kv_var(btree, k, v);

    // set root
    bid[btree->height-1] = btree->root_bid;

    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found .. return NULL
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
            // return (address of) value if KEY == k
            if (!btree->kv_ops->cmp(key, k, btree->aux)) {
                btree->kv_ops->set_value(btree, value_buf, v);
            }else{
                if (btree->blk_ops->blk_operation_end)
                    btree->blk_ops->blk_operation_end(btree->blk_handle);
                if (btree->kv_ops->free_kv_var) {
                    btree->kv_ops->free_kv_var(btree, k, v);
                }
                return BTREE_RESULT_FAIL;
            }
        }
    }
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
    return BTREE_RESULT_SUCCESS;
}